

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserunits.cpp
# Opt level: O0

void __thiscall
AnalyserUnits_trigonometricOperators_Test::TestBody(AnalyserUnits_trigonometricOperators_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  reference __rhs;
  char *pcVar2;
  element_type *peVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_830;
  shared_ptr<libcellml::Logger> local_6a0;
  ScopedTrace local_689;
  undefined1 local_688 [7];
  ScopedTrace gtest_trace_588;
  AnalyserPtr analyser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  iterator local_468;
  size_type local_460;
  undefined1 local_458 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  Message local_438 [8];
  unsigned_long local_430 [2];
  undefined1 local_420 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string local_3d0 [32];
  undefined1 local_3b0 [8];
  ModelPtr model;
  ParserPtr parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *op;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  allocator<char> local_368;
  allocator<char> local_367;
  allocator<char> local_366;
  allocator<char> local_365;
  allocator<char> local_364;
  allocator<char> local_363;
  allocator<char> local_362;
  allocator<char> local_361;
  allocator<char> local_360;
  allocator<char> local_35f;
  allocator<char> local_35e;
  allocator<char> local_35d;
  allocator<char> local_35c;
  allocator<char> local_35b;
  allocator<char> local_35a;
  allocator<char> local_359;
  allocator<char> local_358;
  allocator<char> local_357;
  allocator<char> local_356;
  allocator<char> local_355 [20];
  allocator<char> local_341;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  operators;
  AnalyserUnits_trigonometricOperators_Test *this_local;
  
  __range1._4_1_ = 1;
  local_340 = &local_338;
  operators.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"sin",&local_341);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_318,"cos",local_355);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"tan",&local_356);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d8,"sec",&local_357);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"csc",&local_358);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_298,"cot",&local_359);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_278,"sinh",&local_35a);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,"cosh",&local_35b);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_238,"tanh",&local_35c);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_218,"sech",&local_35d);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f8,"csch",&local_35e);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"coth",&local_35f);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"arcsin",&local_360);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_198,"arccos",&local_361);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"arctan",&local_362);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"arcsec",&local_363);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"arccsc",&local_364);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"arccot",&local_365);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"arcsinh",&local_366);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"arccosh",&local_367);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"arctanh",&local_368);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"arcsech",(allocator<char> *)((long)&__range1 + 7));
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"arccsch",(allocator<char> *)((long)&__range1 + 6));
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"arccoth",(allocator<char> *)((long)&__range1 + 5));
  __range1._4_1_ = 0;
  local_38 = &local_338;
  local_30 = 0x18;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&__range1 + 3));
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l_00,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&__range1 + 3));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&__range1 + 3));
  local_830 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_830 = local_830 + -1;
    std::__cxx11::string::~string((string *)local_830);
  } while (local_830 != &local_338);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  std::allocator<char>::~allocator(&local_368);
  std::allocator<char>::~allocator(&local_367);
  std::allocator<char>::~allocator(&local_366);
  std::allocator<char>::~allocator(&local_365);
  std::allocator<char>::~allocator(&local_364);
  std::allocator<char>::~allocator(&local_363);
  std::allocator<char>::~allocator(&local_362);
  std::allocator<char>::~allocator(&local_361);
  std::allocator<char>::~allocator(&local_360);
  std::allocator<char>::~allocator(&local_35f);
  std::allocator<char>::~allocator(&local_35e);
  std::allocator<char>::~allocator(&local_35d);
  std::allocator<char>::~allocator(&local_35c);
  std::allocator<char>::~allocator(&local_35b);
  std::allocator<char>::~allocator(&local_35a);
  std::allocator<char>::~allocator(&local_359);
  std::allocator<char>::~allocator(&local_358);
  std::allocator<char>::~allocator(&local_357);
  std::allocator<char>::~allocator(&local_356);
  std::allocator<char>::~allocator(local_355);
  std::allocator<char>::~allocator(&local_341);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_28);
  op = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&op), bVar1) {
    __rhs = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1);
    this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    libcellml::Parser::create(SUB81(this_00,0));
    std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &gtest_ar.message_,"analyser/units/",__rhs);
    std::operator+(&local_3f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &gtest_ar.message_,".cellml");
    fileContents(local_3d0);
    libcellml::Parser::parseModel((string *)local_3b0);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    local_430[1] = 0;
    std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    local_430[0] = libcellml::Logger::issueCount();
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_420,"size_t(0)","parser->issueCount()",local_430 + 1,
               local_430);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
    if (!bVar1) {
      testing::Message::Message(local_438);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &expectedIssues.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
                 ,0x23f,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &expectedIssues.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,local_438);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &expectedIssues.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(local_438);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
    analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _7_1_ = 1;
    local_4f0 = &local_4e8;
    std::operator+(&local_550,"The unit of \'3.0\' in \'",__rhs);
    std::operator+(&local_530,&local_550,"(3.0)\' in equation \'b = ");
    std::operator+(&local_510,&local_530,__rhs);
    std::operator+(&local_4e8,&local_510,
                   "(3.0)\' in component \'main\' is not dimensionless. \'3.0\' is in \'second\'.");
    local_4f0 = &local_4c8;
    std::operator+(&local_5b0,"The unit of \'5.0\' in \'",__rhs);
    std::operator+(&local_590,&local_5b0,"(5.0)\' in equation \'c = ");
    std::operator+(&local_570,&local_590,__rhs);
    std::operator+(&local_4c8,&local_570,
                   "(5.0)\' in component \'main\' is not dimensionless. \'5.0\' is in \'volt\' (i.e. \'ampere^-1 x kilogram x metre^2 x second^-3\')."
                  );
    local_4f0 = &local_4a8;
    std::operator+(&local_610,"The unit of \'7.0\' in \'",__rhs);
    std::operator+(&local_5f0,&local_610,"(7.0)\' in equation \'d = ");
    std::operator+(&local_5d0,&local_5f0,__rhs);
    std::operator+(&local_4a8,&local_5d0,
                   "(7.0)\' in component \'main\' is not dimensionless. \'7.0\' is in \'frog\'.");
    local_4f0 = &local_488;
    std::operator+(&local_670,"The unit of \'9.0\' in \'",__rhs);
    std::operator+(&local_650,&local_670,"(9.0)\' in equation \'e = ");
    std::operator+(&local_630,&local_650,__rhs);
    std::operator+(&local_488,&local_630,
                   "(9.0)\' in component \'main\' is not dimensionless. \'9.0\' is in \'imaginary\' (i.e. \'10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16\')."
                  );
    analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _7_1_ = 0;
    local_468 = &local_4e8;
    local_460 = 4;
    this_01 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&analyser.
                         super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 6);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(this_01);
    __l._M_len = local_460;
    __l._M_array = local_468;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_458,__l,this_01);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&analyser.
                            super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 6));
    local_8b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_468;
    do {
      local_8b8 = local_8b8 + -1;
      std::__cxx11::string::~string((string *)local_8b8);
    } while (local_8b8 != &local_4e8);
    std::__cxx11::string::~string((string *)&local_630);
    std::__cxx11::string::~string((string *)&local_650);
    std::__cxx11::string::~string((string *)&local_670);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::__cxx11::string::~string((string *)&local_610);
    std::__cxx11::string::~string((string *)&local_570);
    std::__cxx11::string::~string((string *)&local_590);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::string::~string((string *)&local_550);
    libcellml::Analyser::create();
    peVar3 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_688);
    libcellml::Analyser::analyseModel((shared_ptr *)peVar3);
    testing::ScopedTrace::ScopedTrace
              (&local_689,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
               ,0x24c,"Issue occurred here.");
    std::shared_ptr<libcellml::Logger>::shared_ptr<libcellml::Analyser,void>
              (&local_6a0,(shared_ptr<libcellml::Analyser> *)local_688);
    expectEqualIssues((vector *)local_458,(shared_ptr *)&local_6a0);
    std::shared_ptr<libcellml::Logger>::~shared_ptr(&local_6a0);
    testing::ScopedTrace::~ScopedTrace(&local_689);
    std::shared_ptr<libcellml::Analyser>::~shared_ptr((shared_ptr<libcellml::Analyser> *)local_688);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_458);
    std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_3b0);
    std::shared_ptr<libcellml::Parser>::~shared_ptr
              ((shared_ptr<libcellml::Parser> *)
               &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

TEST(AnalyserUnits, trigonometricOperators)
{
    std::vector<std::string> operators = {"sin", "cos", "tan", "sec", "csc", "cot", "sinh", "cosh", "tanh", "sech", "csch", "coth", "arcsin", "arccos", "arctan", "arcsec", "arccsc", "arccot", "arcsinh", "arccosh", "arctanh", "arcsech", "arccsch", "arccoth"};

    for (const auto &op : operators) {
        auto parser = libcellml::Parser::create();
        auto model = parser->parseModel(fileContents("analyser/units/" + op + ".cellml"));

        EXPECT_EQ(size_t(0), parser->issueCount());

        const std::vector<std::string> expectedIssues = {
            "The unit of '3.0' in '" + op + "(3.0)' in equation 'b = " + op + "(3.0)' in component 'main' is not dimensionless. '3.0' is in 'second'.",
            "The unit of '5.0' in '" + op + "(5.0)' in equation 'c = " + op + "(5.0)' in component 'main' is not dimensionless. '5.0' is in 'volt' (i.e. 'ampere^-1 x kilogram x metre^2 x second^-3').",
            "The unit of '7.0' in '" + op + "(7.0)' in equation 'd = " + op + "(7.0)' in component 'main' is not dimensionless. '7.0' is in 'frog'.",
            "The unit of '9.0' in '" + op + "(9.0)' in equation 'e = " + op + "(9.0)' in component 'main' is not dimensionless. '9.0' is in 'imaginary' (i.e. '10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16').",
        };

        auto analyser = libcellml::Analyser::create();

        analyser->analyseModel(model);

        EXPECT_EQ_ISSUES(expectedIssues, analyser);
    }
}